

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O1

InlinedVector<S2ClosestPointQueryBase<S2MinDistance,_int>::QueueEntry,_16UL,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::QueueEntry>_>
* __thiscall
absl::
InlinedVector<S2ClosestPointQueryBase<S2MinDistance,_int>::QueueEntry,_16UL,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::QueueEntry>_>
::operator=(InlinedVector<S2ClosestPointQueryBase<S2MinDistance,_int>::QueueEntry,_16UL,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::QueueEntry>_>
            *this,InlinedVector<S2ClosestPointQueryBase<S2MinDistance,_int>::QueueEntry,_16UL,_std::allocator<S2ClosestPointQueryBase<S2MinDistance,_int>::QueueEntry>_>
                  *other)

{
  void *pvVar1;
  ulong uVar2;
  ulong uVar3;
  undefined8 uVar4;
  undefined8 *puVar5;
  undefined8 *puVar6;
  Rep *pRVar7;
  Rep *pRVar8;
  Rep *__dest;
  size_t sVar9;
  undefined8 *puVar10;
  Rep *pRVar11;
  void *__s;
  
  if (this != other) {
    if (((other->allocator_and_tag_).tag_.size_ & 1) == 0) {
      if (((this->allocator_and_tag_).tag_.size_ & 1) != 0) {
        clear(this);
      }
      uVar2 = (this->allocator_and_tag_).tag_.size_;
      uVar3 = (other->allocator_and_tag_).tag_.size_;
      if (uVar2 >> 1 < uVar3 >> 1) {
        pRVar7 = &other->rep_;
        pRVar11 = pRVar7;
        if ((uVar3 & 1) != 0) {
          pRVar11 = *(Rep **)((long)&other->rep_ + 8);
        }
        sVar9 = (uVar2 >> 1) * 0x10;
        pRVar8 = &this->rep_;
        if (1 < uVar2) {
          __dest = pRVar8;
          if ((uVar2 & 1) != 0) {
            __dest = *(Rep **)((long)&this->rep_ + 8);
          }
          memmove(__dest,pRVar11,sVar9);
        }
        puVar10 = (undefined8 *)((long)pRVar11 + sVar9);
        uVar2 = (other->allocator_and_tag_).tag_.size_;
        if ((uVar2 & 1) != 0) {
          pRVar7 = *(Rep **)((long)&other->rep_ + 8);
        }
        puVar5 = (undefined8 *)((uVar2 & 0xfffffffffffffffe) * 8 + (long)pRVar7);
        if (puVar10 != puVar5) {
          uVar2 = (this->allocator_and_tag_).tag_.size_;
          if ((uVar2 & 1) != 0) {
            pRVar8 = *(Rep **)((long)&this->rep_ + 8);
          }
          puVar6 = (undefined8 *)((uVar2 & 0xfffffffffffffffe) * 8 + (long)pRVar8);
          do {
            uVar4 = puVar10[1];
            *puVar6 = *puVar10;
            puVar6[1] = uVar4;
            puVar6 = puVar6 + 2;
            puVar10 = puVar10 + 2;
          } while (puVar10 != puVar5);
        }
      }
      else {
        pRVar7 = &this->rep_;
        pRVar11 = pRVar7;
        if ((uVar2 & 1) != 0) {
          pRVar11 = *(Rep **)((long)&this->rep_ + 8);
        }
        sVar9 = (uVar3 >> 1) * 0x10;
        if (1 < uVar3) {
          if ((uVar3 & 1) == 0) {
            pRVar8 = &other->rep_;
          }
          else {
            pRVar8 = *(Rep **)((long)&other->rep_ + 8);
          }
          memmove(pRVar11,pRVar8,sVar9);
        }
        __s = (void *)((long)pRVar11 + sVar9);
        uVar2 = (this->allocator_and_tag_).tag_.size_;
        if ((uVar2 & 1) != 0) {
          pRVar7 = *(Rep **)((long)&this->rep_ + 8);
        }
        pvVar1 = (void *)((long)pRVar7 + (uVar2 & 0xfffffffffffffffe) * 8);
        if (__s != pvVar1) {
          memset(__s,0xab,(long)pvVar1 - (long)__s);
        }
      }
      (this->allocator_and_tag_).tag_.size_ =
           (other->allocator_and_tag_).tag_.size_ & 0xfffffffffffffffe;
    }
    else {
      clear(this);
      (this->allocator_and_tag_).tag_.size_ = (other->allocator_and_tag_).tag_.size_ | 1;
      uVar4 = *(undefined8 *)((long)&other->rep_ + 8);
      *(undefined8 *)&this->rep_ = *(undefined8 *)&other->rep_;
      *(undefined8 *)((long)&this->rep_ + 8) = uVar4;
      (other->allocator_and_tag_).tag_.size_ = 0;
    }
  }
  return this;
}

Assistant:

InlinedVector& operator=(InlinedVector&& other) {
    if (ABSL_PREDICT_FALSE(this == &other)) return *this;

    if (other.allocated()) {
      clear();
      tag().set_allocated_size(other.size());
      init_allocation(other.allocation());
      other.tag() = Tag();
    } else {
      if (allocated()) clear();
      // Both are inlined now.
      if (size() < other.size()) {
        auto mid = std::make_move_iterator(other.begin() + size());
        std::copy(std::make_move_iterator(other.begin()), mid, begin());
        UninitializedCopy(mid, std::make_move_iterator(other.end()), end());
      } else {
        auto new_end = std::copy(std::make_move_iterator(other.begin()),
                                 std::make_move_iterator(other.end()), begin());
        Destroy(new_end, end());
      }
      tag().set_inline_size(other.size());
    }
    return *this;
  }